

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposerTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0ba4::CaseInsensitiveComparator::~CaseInsensitiveComparator
          (CaseInsensitiveComparator *this)

{
  void *in_RDI;
  
  ~CaseInsensitiveComparator((CaseInsensitiveComparator *)0x1745b8);
  operator_delete(in_RDI,8);
  return;
}

Assistant:

bool contentsAreEquivalent(std::string receivedPath,
                                   std::string approvedPath) const override
        {
            std::ifstream receivedStream(receivedPath.c_str());
            std::ifstream approvedStream(approvedPath.c_str());

            using InputIter = std::istreambuf_iterator<char>;

            auto receivedText = std::string(InputIter{receivedStream}, InputIter{});
            auto approvedText = std::string(InputIter{approvedStream}, InputIter{});

            return StringUtils::toLower(receivedText) ==
                   StringUtils::toLower(approvedText);
        }